

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<wchar_t>>::hex_writer>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<wchar_t>>::hex_writer>
             *this,wchar_t **it)

{
  wchar_t wVar1;
  uint uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  wchar_t *pwVar7;
  wchar_t *pwVar8;
  long lVar9;
  char *pcVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  int iVar15;
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  int iVar18;
  undefined1 auVar17 [16];
  
  lVar9 = *(long *)(this + 8);
  if (lVar9 != 0) {
    pwVar7 = *it;
    if (0 < lVar9) {
      pcVar10 = *(char **)this;
      lVar9 = lVar9 + 1;
      do {
        *pwVar7 = (int)*pcVar10;
        pcVar10 = pcVar10 + 1;
        pwVar7 = pwVar7 + 1;
        lVar9 = lVar9 + -1;
      } while (1 < lVar9);
    }
    *it = pwVar7;
  }
  auVar6 = _DAT_00137fc0;
  auVar5 = _DAT_00137fb0;
  auVar4 = _DAT_00137010;
  pwVar8 = *it;
  lVar9 = *(long *)(this + 0x18);
  pwVar7 = pwVar8;
  if (lVar9 != 0) {
    pwVar7 = pwVar8 + lVar9;
    wVar1 = *(wchar_t *)(this + 0x10);
    uVar12 = lVar9 + 0x3fffffffffffffffU & 0x3fffffffffffffff;
    auVar14._8_4_ = (int)uVar12;
    auVar14._0_8_ = uVar12;
    auVar14._12_4_ = (int)(uVar12 >> 0x20);
    lVar13 = 0;
    auVar14 = auVar14 ^ _DAT_00137010;
    do {
      auVar16._8_4_ = (int)lVar13;
      auVar16._0_8_ = lVar13;
      auVar16._12_4_ = (int)((ulong)lVar13 >> 0x20);
      auVar17 = (auVar16 | auVar6) ^ auVar4;
      iVar15 = auVar14._4_4_;
      if ((bool)(~(auVar17._4_4_ == iVar15 && auVar14._0_4_ < auVar17._0_4_ ||
                  iVar15 < auVar17._4_4_) & 1)) {
        pwVar8[lVar13] = wVar1;
      }
      if ((auVar17._12_4_ != auVar14._12_4_ || auVar17._8_4_ <= auVar14._8_4_) &&
          auVar17._12_4_ <= auVar14._12_4_) {
        pwVar8[lVar13 + 1] = wVar1;
      }
      auVar16 = (auVar16 | auVar5) ^ auVar4;
      iVar18 = auVar16._4_4_;
      if (iVar18 <= iVar15 && (iVar18 != iVar15 || auVar16._0_4_ <= auVar14._0_4_)) {
        pwVar8[lVar13 + 2] = wVar1;
        pwVar8[lVar13 + 3] = wVar1;
      }
      lVar13 = lVar13 + 4;
    } while ((uVar12 - ((uint)(lVar9 + 0x3fffffffffffffffU) & 3)) + 4 != lVar13);
  }
  *it = pwVar7;
  uVar2 = *(uint *)(this + 0x28);
  pcVar10 = "0123456789ABCDEF";
  if (*(int *)(*(long *)(*(long *)(this + 0x20) + 8) + 0x14) == 0x78) {
    pcVar10 = "0123456789abcdef";
  }
  pwVar8 = pwVar7 + uVar2;
  uVar11 = *(uint *)(*(long *)(this + 0x20) + 0x10);
  do {
    pwVar8 = pwVar8 + -1;
    *pwVar8 = (int)pcVar10[uVar11 & 0xf];
    bVar3 = 0xf < uVar11;
    uVar11 = uVar11 >> 4;
  } while (bVar3);
  *it = pwVar7 + uVar2;
  return;
}

Assistant:

FMT_CONSTEXPR size_t size() const { return size_; }